

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTypes::visit(SemanticTypes *this,MultiplicationOPNode *multiplicationOpNode)

{
  ExpNode *pEVar1;
  bool bVar2;
  
  pEVar1 = multiplicationOpNode->exp1;
  if (pEVar1 == (ExpNode *)0x0) {
    visit((SemanticTypes *)multiplicationOpNode);
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = multiplicationOpNode->exp2;
    if (pEVar1 == (ExpNode *)0x0) {
      visit((SemanticTypes *)multiplicationOpNode);
    }
    else {
      (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
      pEVar1 = multiplicationOpNode->exp1;
      bVar2 = _match_exp_types(pEVar1,multiplicationOpNode->exp2);
      if (bVar2) {
        if (pEVar1->type - 0xbU < 2) {
          (multiplicationOpNode->super_ExpNode).type = pEVar1->type;
          (multiplicationOpNode->super_ExpNode).typeLexeme = pEVar1->typeLexeme;
          (multiplicationOpNode->super_ExpNode).pointer = pEVar1->pointer;
          (multiplicationOpNode->super_ExpNode).arraySize = pEVar1->arraySize;
          (multiplicationOpNode->super_ExpNode).lValue = false;
        }
        else {
          visit((SemanticTypes *)multiplicationOpNode);
        }
      }
      else {
        visit((SemanticTypes *)multiplicationOpNode);
      }
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(MultiplicationOPNode *multiplicationOpNode) {

    if (multiplicationOpNode->getExp1())
        multiplicationOpNode->getExp1()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - multiplicationOpNode] NO EXPRESSION TO BE ASSIGNED, line: %d\n",
                multiplicationOpNode->getLine());
        return;
    }

    if (multiplicationOpNode->getExp2())
        multiplicationOpNode->getExp2()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - multiplicationOpNode] NO EXPRESSION TO ASSIGN, line: %d\n",
                multiplicationOpNode->getLine());
        return;
    }


    if (!_match_exp_types(multiplicationOpNode->getExp1(), multiplicationOpNode->getExp2())) {
        fprintf(stderr,
                "[SEMANTIC ERROR - multiplicationOpNode] CANNOT ASSIGN AN EXPRESSION TO A DIFFERENT TYPE, line: %d\n",
                multiplicationOpNode->getLine());
        return;
    }

    if (multiplicationOpNode->getExp1()->getType() != INT && multiplicationOpNode->getExp1()->getType() != FLOAT) {
        fprintf(stderr,
                "[SEMANTIC ERROR - multiplicationOpNode] CANNOT OPERATE WITH NON NUMERIC VALUES, line: %d\n",
                multiplicationOpNode->getLine());
        return;
    }

    multiplicationOpNode->setType(multiplicationOpNode->getExp1()->getType());
    multiplicationOpNode->setTypeLexeme(multiplicationOpNode->getExp1()->getTypeLexeme());
    multiplicationOpNode->setPointer(multiplicationOpNode->getExp1()->isPointer());
    multiplicationOpNode->setArraySize(multiplicationOpNode->getExp1()->getArraySize());
    multiplicationOpNode->setLValue(false);
}